

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_utils.hpp
# Opt level: O2

unsigned_long __thiscall
duckdb::NumericCastImpl<unsigned_long,_duckdb::hugeint_t,_false>::Convert
          (NumericCastImpl<unsigned_long,_duckdb::hugeint_t,_false> *this,hugeint_t val)

{
  hugeint_t params;
  bool bVar1;
  uint64_t uVar2;
  InternalException *this_00;
  hugeint_t val_local;
  type unsigned_in;
  uhugeint_t local_68;
  string local_58;
  type signed_in;
  
  val_local.upper = val.lower;
  val_local.lower = (uint64_t)this;
  unsigned_in = hugeint_t::operator_cast_to_uhugeint_t(&val_local);
  signed_in.lower = val_local.lower;
  signed_in.upper = val_local.upper;
  hugeint_t::hugeint_t((hugeint_t *)&local_58,0);
  bVar1 = hugeint_t::operator<(&signed_in,(hugeint_t *)&local_58);
  if (!bVar1) {
    uhugeint_t::uhugeint_t(&local_68,0xffffffffffffffff);
    bVar1 = uhugeint_t::operator>(&unsigned_in,&local_68);
    if (!bVar1) {
      uVar2 = hugeint_t::operator_cast_to_unsigned_long(&val_local);
      return uVar2;
    }
  }
  params.upper = val_local.upper;
  params.lower = val_local.lower;
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,
             "Information loss on integer cast: value %d outside of target range [%d, %d]",
             (allocator *)&local_68);
  InternalException::InternalException<duckdb::hugeint_t,unsigned_long,unsigned_long>
            (this_00,&local_58,params,0,0xffffffffffffffff);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static TO Convert(FROM val) {
		// some dance around signed-unsigned integer comparison below
		auto minval = NumericLimits<TO>::Minimum();
		auto maxval = NumericLimits<TO>::Maximum();
		auto unsigned_in = static_cast<typename MakeUnsigned<FROM>::type>(val);
		auto unsigned_min = static_cast<typename MakeUnsigned<TO>::type>(minval);
		auto unsigned_max = static_cast<typename MakeUnsigned<TO>::type>(maxval);
		auto signed_in = static_cast<typename MakeSigned<FROM>::type>(val);
		auto signed_min = static_cast<typename MakeSigned<TO>::type>(minval);
		auto signed_max = static_cast<typename MakeSigned<TO>::type>(maxval);

		if (!NumericLimits<FROM>::IsSigned() && !NumericLimits<TO>::IsSigned() &&
		    (unsigned_in < unsigned_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(unsigned_min), static_cast<TO>(unsigned_max));
		}

		if (NumericLimits<FROM>::IsSigned() && NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || signed_in > signed_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(signed_max));
		}

		if (NumericLimits<FROM>::IsSigned() != NumericLimits<TO>::IsSigned() &&
		    (signed_in < signed_min || unsigned_in > unsigned_max)) {
			ThrowNumericCastError(val, static_cast<TO>(signed_min), static_cast<TO>(unsigned_max));
		}

		return static_cast<TO>(val);
	}